

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_throw::~statement_throw(statement_throw *this)

{
  statement_throw *in_RDI;
  
  ~statement_throw(in_RDI);
  statement_base::operator_delete((void *)0x5e8452);
  return;
}

Assistant:

statement_throw() = delete;